

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

float __thiscall
duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::Operation<duckdb::hugeint_t,float>
          (VectorDecimalCastOperator<duckdb::TryCastFromDecimal> *this,hugeint_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  hugeint_t input_00;
  float result_value;
  uint8_t in_stack_ffffffffffffffa8;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  input_00.lower = input.lower;
  input_00.upper = (int64_t)&local_44;
  bVar1 = TryCastFromDecimal::Operation<duckdb::hugeint_t,float>
                    ((TryCastFromDecimal *)this,input_00,*(float **)(idx + 8),
                     (CastParameters *)(ulong)*(byte *)(idx + 0x18),*(uint8_t *)(idx + 0x19),
                     in_stack_ffffffffffffffa8);
  local_48 = local_44;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_49);
    local_48 = HandleVectorCastError::Operation<float>
                         (&local_40,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx
                         );
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return local_48;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}